

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O3

void __thiscall aeron::ClientConductor::~ClientConductor(ClientConductor *this)

{
  pointer pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pIVar2;
  Image *pIVar3;
  _Manager_type p_Var4;
  ImageList *pIVar5;
  long lVar6;
  shared_ptr<aeron::Subscription> *__x;
  pointer pSVar7;
  pointer pIVar8;
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  subscriptions;
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  local_48;
  
  this->_vptr_ClientConductor = (_func_int **)&PTR__ClientConductor_00163730;
  local_48.
  super__Vector_base<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar7 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->m_subscriptions).
           super__Vector_base<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar7 != pSVar1) {
    __x = &pSVar7->m_subscriptionCache;
    do {
      std::
      vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
      ::push_back(&local_48,__x);
      this_00 = (__x->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (__x->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      (__x->super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      pSVar7 = (pointer)(__x + 6);
      __x = __x + 0xc;
    } while (pSVar7 != pSVar1);
  }
  pIVar2 = (this->m_lingeringImageLists).
           super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar8 = (this->m_lingeringImageLists).
                super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar8 != pIVar2; pIVar8 = pIVar8 + 1) {
    pIVar5 = pIVar8->m_imageList;
    pIVar3 = pIVar5->m_images;
    if (pIVar3 != (Image *)0x0) {
      if (*(long *)&pIVar3[-1].m_positionBitsToShift != 0) {
        lVar6 = *(long *)&pIVar3[-1].m_positionBitsToShift * 0x128;
        do {
          Image::~Image((Image *)((long)pIVar3[-1].m_termBuffers._M_elems + lVar6 + -8));
          lVar6 = lVar6 + -0x128;
        } while (lVar6 != 0);
      }
      operator_delete__(&pIVar3[-1].m_positionBitsToShift);
      pIVar5 = pIVar8->m_imageList;
    }
    operator_delete(pIVar5);
    pIVar8->m_imageList = (ImageList *)0x0;
  }
  DriverProxy::clientClose(this->m_driverProxy);
  std::
  vector<std::shared_ptr<aeron::Subscription>,_std::allocator<std::shared_ptr<aeron::Subscription>_>_>
  ::~vector(&local_48);
  p_Var4 = (this->m_epochClock).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_epochClock,(_Any_data *)&this->m_epochClock,__destroy_functor);
  }
  p_Var4 = (this->m_onUnavailableCounterHandler).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_onUnavailableCounterHandler,
              (_Any_data *)&this->m_onUnavailableCounterHandler,__destroy_functor);
  }
  p_Var4 = (this->m_onAvailableCounterHandler).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_onAvailableCounterHandler,
              (_Any_data *)&this->m_onAvailableCounterHandler,__destroy_functor);
  }
  p_Var4 = (this->m_errorHandler).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_errorHandler,(_Any_data *)&this->m_errorHandler,
              __destroy_functor);
  }
  p_Var4 = (this->m_onNewSubscriptionHandler).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_onNewSubscriptionHandler,
              (_Any_data *)&this->m_onNewSubscriptionHandler,__destroy_functor);
  }
  p_Var4 = (this->m_onNewExclusivePublicationHandler).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_onNewExclusivePublicationHandler,
              (_Any_data *)&this->m_onNewExclusivePublicationHandler,__destroy_functor);
  }
  p_Var4 = (this->m_onNewPublicationHandler).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&this->m_onNewPublicationHandler,
              (_Any_data *)&this->m_onNewPublicationHandler,__destroy_functor);
  }
  pIVar8 = (this->m_lingeringImageLists).
           super__Vector_base<aeron::ClientConductor::ImageListLingerDefn,_std::allocator<aeron::ClientConductor::ImageListLingerDefn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pIVar8 != (pointer)0x0) {
    operator_delete(pIVar8);
  }
  std::
  vector<aeron::ClientConductor::LogBuffersLingerDefn,_std::allocator<aeron::ClientConductor::LogBuffersLingerDefn>_>
  ::~vector(&this->m_lingeringLogBuffers);
  std::
  vector<aeron::ClientConductor::CounterStateDefn,_std::allocator<aeron::ClientConductor::CounterStateDefn>_>
  ::~vector(&this->m_counters);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  ::~vector(&this->m_subscriptions);
  std::
  vector<aeron::ClientConductor::ExclusivePublicationStateDefn,_std::allocator<aeron::ClientConductor::ExclusivePublicationStateDefn>_>
  ::~vector(&this->m_exclusivePublications);
  std::
  vector<aeron::ClientConductor::PublicationStateDefn,_std::allocator<aeron::ClientConductor::PublicationStateDefn>_>
  ::~vector(&this->m_publications);
  return;
}

Assistant:

ClientConductor::~ClientConductor()
{
    std::vector<std::shared_ptr<Subscription>> subscriptions;

    std::for_each(m_subscriptions.begin(), m_subscriptions.end(),
        [&subscriptions](SubscriptionStateDefn& entry)
        {
            subscriptions.push_back(entry.m_subscriptionCache);
            entry.m_subscriptionCache.reset();
        });

    std::for_each(m_lingeringImageLists.begin(), m_lingeringImageLists.end(),
        [](ImageListLingerDefn & entry)
        {
            delete[] entry.m_imageList->m_images;
            delete entry.m_imageList;
            entry.m_imageList = nullptr;
        });

    m_driverProxy.clientClose();
}